

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O0

void __thiscall Memory::HeapInfo::FinishPartialCollect(HeapInfo *this,RecyclerSweep *recyclerSweep)

{
  uint local_20;
  uint local_1c;
  uint i_1;
  uint i;
  RecyclerSweep *recyclerSweep_local;
  HeapInfo *this_local;
  
  for (local_1c = 0; local_1c < 0x30; local_1c = local_1c + 1) {
    HeapBucketGroup<SmallAllocationBlockAttributes>::FinishPartialCollect
              (this->heapBuckets + local_1c,recyclerSweep);
  }
  for (local_20 = 0; local_20 < 0x1d; local_20 = local_20 + 1) {
    HeapBucketGroup<MediumAllocationBlockAttributes>::FinishPartialCollect
              (this->mediumHeapBuckets + local_20,recyclerSweep);
  }
  LargeHeapBucket::FinishPartialCollect(&this->largeObjectBucket,recyclerSweep);
  return;
}

Assistant:

void HeapInfo::FinishPartialCollect(RecyclerSweep * recyclerSweep)
{
    for (uint i = 0; i < HeapConstants::BucketCount; i++)
    {
        heapBuckets[i].FinishPartialCollect(recyclerSweep);
    }

#ifdef BUCKETIZE_MEDIUM_ALLOCATIONS
    for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
    {
        mediumHeapBuckets[i].FinishPartialCollect(recyclerSweep);
    }
#endif

    largeObjectBucket.FinishPartialCollect(recyclerSweep);
}